

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckerTester.h
# Opt level: O2

void __thiscall psy::C::TypeCheckerTester::~TypeCheckerTester(TypeCheckerTester *this)

{
  ~TypeCheckerTester(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

TypeCheckerTester(TestSuite* suite)
        : Tester(suite)
    {}